

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdGetSighashTypeFromSchnorrSignature
              (void *handle,char *signature,int *sighash_type,bool *anyone_can_pay)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this;
  SchnorrSignature sig;
  SigHashType sighash_type_obj;
  allocator local_79;
  SchnorrSignature local_78;
  string local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_50,signature,&local_79);
    cfd::core::SchnorrSignature::SchnorrSignature(&local_78,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    cfd::core::SchnorrSignature::GetSigHashType((SchnorrSignature *)&local_50);
    if (sighash_type != (int *)0x0) {
      uVar2 = cfd::core::SigHashType::GetSigHashFlag((SigHashType *)&local_50);
      *sighash_type = uVar2;
    }
    if (anyone_can_pay != (bool *)0x0) {
      bVar1 = cfd::core::SigHashType::IsAnyoneCanPay((SigHashType *)&local_50);
      *anyone_can_pay = bVar1;
    }
    if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x2e9;
  local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdGetSighashTypeFromSchnorrSignature";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"signature is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_78.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Failed to parameter. signature is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_78);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSighashTypeFromSchnorrSignature(
    void* handle, const char* signature, int* sighash_type,
    bool* anyone_can_pay) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    SchnorrSignature sig(signature);
    auto sighash_type_obj = sig.GetSigHashType();
    if (sighash_type != nullptr) {
      *sighash_type = static_cast<int>(sighash_type_obj.GetSigHashFlag());
    }
    if (anyone_can_pay != nullptr) {
      *anyone_can_pay = sighash_type_obj.IsAnyoneCanPay();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}